

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex_dead_code_elimination.cpp
# Opt level: O2

void __thiscall
optimization::complex_dce::ComplexDceRunner::delete_excess_vars(ComplexDceRunner *this)

{
  MirFunction *pMVar1;
  _Base_ptr p_Var2;
  iterator iVar3;
  _Base_ptr p_Var4;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  _Base_ptr __args;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  pMVar1 = this->f;
  for (p_Var4 = (pMVar1->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(pMVar1->basic_blks)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    local_38 = 0;
    local_48 = 0;
    uStack_40 = 0;
    p_Var2 = p_Var4[3]._M_left;
    for (__args = p_Var4[3]._M_parent; __args != p_Var2; __args = (_Base_ptr)&__args->_M_parent) {
      iVar3 = std::
              _Hashtable<mir::inst::VarId,_mir::inst::VarId,_std::allocator<mir::inst::VarId>,_std::__detail::_Identity,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&(this->do_not_delete)._M_h,
                     (key_type *)
                     ((long)*(__uniq_ptr_data<mir::inst::Inst,_std::default_delete<mir::inst::Inst>,_true,_true>
                              *)__args + 8));
      if (iVar3.super__Node_iterator_base<mir::inst::VarId,_true>._M_cur == (__node_type *)0x0) {
        this->it_changed = true;
      }
      else {
        std::
        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
        ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                  ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                    *)&local_48,
                   (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)__args);
      }
    }
    std::
    vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
    ::_M_move_assign((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      *)&p_Var4[3]._M_parent,
                     (vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                      *)&local_48);
    std::
    vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
    ::~vector((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
               *)&local_48);
  }
  return;
}

Assistant:

void ComplexDceRunner::delete_excess_vars() {
  for (auto& bb : f.basic_blks) {
    auto new_inst = std::vector<std::unique_ptr<Inst>>();
    for (auto& inst : bb.second.inst) {
      if (do_not_delete.find(inst->dest) != do_not_delete.end()) {
        new_inst.push_back(std::move(inst));
      } else {
        it_changed = true;
      }
    }
    bb.second.inst = std::move(new_inst);
  }
}